

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.h
# Opt level: O3

void gen_uc_tracecode(TCGContext_conflict1 *tcg_ctx,int32_t size,int32_t type,void *uc,uint64_t pc)

{
  long lVar1;
  uintptr_t o_3;
  TCGv_i32 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  uintptr_t o;
  TCGTemp *ts;
  uintptr_t o_1;
  TCGTemp *ts_00;
  uintptr_t o_2;
  TCGTemp *ts_01;
  undefined8 *puVar5;
  TCGTemp *args [4];
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  pTVar2 = tcg_const_i32_aarch64(tcg_ctx,size);
  pTVar3 = tcg_const_i64_aarch64(tcg_ctx,(int64_t)uc);
  pTVar4 = tcg_const_i64_aarch64(tcg_ctx,pc);
  ts = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
  ts_00 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
  ts_01 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  local_60 = (TCGTemp *)0x0;
  local_78 = ts;
  local_70 = ts_00;
  local_68 = ts_01;
  if (*(int *)((long)uc + (ulong)(uint)type * 4 + 0x4f0) == 1) {
    for (puVar5 = *(undefined8 **)((long)uc + (ulong)(uint)type * 0x18 + 0x328);
        puVar5 != (undefined8 *)0x0; puVar5 = (undefined8 *)*puVar5) {
      lVar1 = puVar5[1];
      if (*(char *)(lVar1 + 0x14) == '\0') {
        pTVar3 = tcg_const_i64_aarch64(tcg_ctx,*(int64_t *)(lVar1 + 0x30));
        local_60 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
        (**(code **)((long)uc + 0x178))(uc,lVar1,&local_78,4);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      }
    }
  }
  else {
    pTVar2 = tcg_const_i32_aarch64(tcg_ctx,type);
    local_58 = ts_01;
    local_50 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    local_48 = ts;
    local_40 = ts_00;
    tcg_gen_callN_aarch64(tcg_ctx,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_58);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,ts_00);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts_01);
  return;
}

Assistant:

static inline void gen_uc_tracecode(TCGContext *tcg_ctx, int32_t size, int32_t type, void *uc, uint64_t pc)
{
    TCGv_i32 tsize = tcg_const_i32(tcg_ctx, size);
    TCGv_i32 ttype;
    TCGv_ptr tuc = tcg_const_ptr(tcg_ctx, uc);
    TCGv_i64 tpc = tcg_const_i64(tcg_ctx, pc);
    TCGv_ptr tdata;
    uc_engine* puc = uc;
    struct list_item *cur;
    struct hook* hk;
    TCGTemp* args[] = {
        tcgv_ptr_temp(tcg_ctx, tuc),
        tcgv_i64_temp(tcg_ctx, tpc),
        tcgv_i32_temp(tcg_ctx, tsize),
        0
    };

    if (puc->hooks_count[type] == 1) {
        cur = puc->hook[type].head;
        
        while (cur) {
            hk = cur->data;
            if (!hk->to_delete) {
                tdata = tcg_const_ptr(tcg_ctx, hk->user_data);
                args[3] = tcgv_ptr_temp(tcg_ctx, tdata);
                puc->add_inline_hook(uc, hk, (void**)args, 4);
                tcg_temp_free_ptr(tcg_ctx, tdata);
            }
            cur = cur->next;
        }

    } else {
        ttype = tcg_const_i32(tcg_ctx, type);
        gen_helper_uc_tracecode(tcg_ctx, tsize, ttype, tuc, tpc);
        tcg_temp_free_i32(tcg_ctx, ttype);
    }
    tcg_temp_free_i64(tcg_ctx, tpc);
    tcg_temp_free_ptr(tcg_ctx, tuc);
    tcg_temp_free_i32(tcg_ctx, tsize);
}